

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O2

Index __thiscall
MultiAgentDecisionProcess::GetAgentIndexByName(MultiAgentDecisionProcess *this,string *s)

{
  __type_conflict _Var1;
  ostream *poVar2;
  E *this_00;
  pointer pAVar3;
  Index local_1dc;
  char *local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  pAVar3 = (this->_m_agents).super__Vector_base<Agent,_std::allocator<Agent>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pAVar3 == (this->_m_agents).super__Vector_base<Agent,_std::allocator<Agent>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar2 = std::operator<<(local_1a8,"GetAgentIndexByName - agent \"");
      poVar2 = std::operator<<(poVar2,(string *)s);
      poVar2 = std::operator<<(poVar2," not found.");
      std::endl<char,std::char_traits<char>>(poVar2);
      this_00 = (E *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      E::E(this_00,local_1d8);
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    std::__cxx11::string::string
              ((string *)&ss,(string *)&(pAVar3->super_NamedDescribedEntity)._m_name);
    _Var1 = std::operator==(s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ss);
    if (_Var1) {
      local_1dc = (pAVar3->super_DiscreteEntity)._m_index;
    }
    std::__cxx11::string::~string((string *)&ss);
    pAVar3 = pAVar3 + 1;
  } while (!_Var1);
  return local_1dc;
}

Assistant:

Index MultiAgentDecisionProcess::GetAgentIndexByName(const string &s) const	       
{
    vector<Agent>::const_iterator it;
    for(it = _m_agents.begin(); it != _m_agents.end(); it++)
    {
        string s2 = (*it).GetName();
        if(s == s2)
            return( (*it).GetIndex() );
    }
    //not found
    stringstream ss;
    ss << "GetAgentIndexByName - agent \"" << s << " not found." << endl;
    throw E(ss.str().c_str());
}